

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O2

int Abc_NtkCollectPiPos_rec(Abc_Obj_t *pNet,Vec_Ptr_t *vLiMaps,Vec_Ptr_t *vLoMaps)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pNtk;
  uint uVar4;
  int iVar5;
  char *__assertion;
  long lVar6;
  Abc_Obj_t *pObj;
  
  if ((*(uint *)&pNet->field_0x14 & 0xf) != 6) {
    __assertion = "Abc_ObjIsNet(pNet)";
    uVar3 = 0x61;
LAB_00696289:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                  ,uVar3,"int Abc_NtkCollectPiPos_rec(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  iVar2 = Abc_NodeIsTravIdCurrent(pNet);
  iVar5 = 0;
  if (iVar2 == 0) {
    Abc_NodeSetTravIdCurrent(pNet);
    pObj = (Abc_Obj_t *)pNet->pNtk->vObjs->pArray[*(pNet->vFanins).pArray];
    uVar3 = *(uint *)&pObj->field_0x14;
    iVar5 = 0;
    if ((uVar3 & 0xf) == 7) {
      iVar5 = 0;
      for (lVar6 = 0; lVar6 < (pObj->vFanins).nSize; lVar6 = lVar6 + 1) {
        iVar2 = Abc_NtkCollectPiPos_rec
                          ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]],
                           vLiMaps,vLoMaps);
        iVar5 = iVar5 + iVar2;
      }
      uVar3 = *(uint *)&pObj->field_0x14;
    }
    uVar4 = uVar3 & 0xf;
    if (uVar4 != 7) {
      if (uVar4 == 5) {
        pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
        uVar3 = *(uint *)&pObj->field_0x14;
        uVar4 = uVar3 & 0xf;
      }
      if (((uVar3 & 0xe) != 8) && (uVar4 != 10)) {
        __assertion = "Abc_ObjIsBox(pObj)";
        uVar3 = 0x6d;
        goto LAB_00696289;
      }
      for (lVar6 = 0; lVar6 < (pObj->vFanouts).nSize; lVar6 = lVar6 + 1) {
        plVar1 = (long *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar6]];
        Abc_NodeSetTravIdCurrent
                  (*(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8));
      }
      for (lVar6 = 0; lVar6 < (pObj->vFanins).nSize; lVar6 = lVar6 + 1) {
        plVar1 = (long *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]];
        iVar2 = Abc_NtkCollectPiPos_rec
                          (*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8)
                           ,vLiMaps,vLoMaps);
        iVar5 = iVar5 + iVar2;
      }
      pNtk = Abc_ObjModel(pObj);
      iVar2 = Abc_NtkCollectPiPos_int(pObj,pNtk,vLiMaps,vLoMaps);
      iVar5 = iVar5 + iVar2;
    }
  }
  return iVar5;
}

Assistant:

int Abc_NtkCollectPiPos_rec( Abc_Obj_t * pNet, Vec_Ptr_t * vLiMaps, Vec_Ptr_t * vLoMaps )
{
    extern int Abc_NtkCollectPiPos_int( Abc_Obj_t * pBox, Abc_Ntk_t * pNtk, Vec_Ptr_t * vLiMaps, Vec_Ptr_t * vLoMaps );
    Abc_Obj_t * pObj, * pFanin; 
    int i, Counter = 0;
    assert( Abc_ObjIsNet(pNet) );
    if ( Abc_NodeIsTravIdCurrent( pNet ) )
        return 0;
    Abc_NodeSetTravIdCurrent( pNet );
    pObj = Abc_ObjFanin0(pNet);
    if ( Abc_ObjIsNode(pObj) )
        Abc_ObjForEachFanin( pObj, pFanin, i )
            Counter += Abc_NtkCollectPiPos_rec( pFanin, vLiMaps, vLoMaps );
    if ( Abc_ObjIsNode(pObj) )
        return Counter;
    if ( Abc_ObjIsBo(pObj) )
        pObj = Abc_ObjFanin0(pObj);
    assert( Abc_ObjIsBox(pObj) );
    Abc_ObjForEachFanout( pObj, pFanin, i )
        Abc_NodeSetTravIdCurrent( Abc_ObjFanout0(pFanin) );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Counter += Abc_NtkCollectPiPos_rec( Abc_ObjFanin0(pFanin), vLiMaps, vLoMaps );
    Counter += Abc_NtkCollectPiPos_int( pObj, Abc_ObjModel(pObj), vLiMaps, vLoMaps );
    return Counter;
}